

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O2

int btbb_decode_header(btbb_packet *pkt)

{
  char *output;
  uint8_t hec;
  uint8_t uVar1;
  uint16_t data;
  int iVar2;
  int iVar3;
  char local_48 [8];
  char header [18];
  
  iVar3 = 0;
  if ((pkt->flags & 0x10) != 0) {
    iVar2 = unfec13(pkt->symbols + 0x44,local_48,0x12);
    if (iVar2 != 0) {
      output = pkt->packet_header;
      iVar3 = 0;
      unwhiten(local_48,output,pkt->clock,0x12,0,pkt);
      data = air_to_host16(output,10);
      hec = air_to_host8(pkt->packet_header + 10,8);
      uVar1 = uap_from_hec(data,hec);
      if (uVar1 == pkt->UAP) {
        uVar1 = air_to_host8(output,3);
        pkt->packet_lt_addr = uVar1;
        uVar1 = air_to_host8(pkt->packet_header + 3,4);
        pkt->packet_type = uVar1;
        uVar1 = air_to_host8(pkt->packet_header + 7,3);
        pkt->packet_flags = uVar1;
        pkt->packet_hec = hec;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int btbb_decode_header(btbb_packet* pkt)
{
	/* skip 72 bit access code */
	char *stream = pkt->symbols + 68;
	/* 18 bit packet header */
	char header[18];
	uint8_t UAP;

	if (btbb_packet_get_flag(pkt, BTBB_CLK6_VALID) && unfec13(stream, header, 18)) {
		unwhiten(header, pkt->packet_header, pkt->clock, 18, 0, pkt);
		uint16_t hdr_data = air_to_host16(pkt->packet_header, 10);
		uint8_t hec = air_to_host8(&pkt->packet_header[10], 8);
		UAP = uap_from_hec(hdr_data, hec);
		if (UAP == pkt->UAP) {
			pkt->packet_lt_addr = air_to_host8(&pkt->packet_header[0], 3);
			pkt->packet_type = air_to_host8(&pkt->packet_header[3], 4);
			pkt->packet_flags = air_to_host8(&pkt->packet_header[7], 3);
			pkt->packet_hec = hec;
			return 1;
		}
	}
	
	return 0;
}